

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

bool __thiscall cmsys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  char cVar1;
  ushort uVar2;
  ulong in_RAX;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  int flags;
  undefined8 uStack_38;
  
  if (exp == (char *)0x0) {
    pcVar3 = "RegularExpression::compile(): No expression supplied.";
  }
  else {
    regnpar = 1;
    regcode = &regdummy;
    regsize = 1;
    regparse = exp;
    uStack_38 = in_RAX;
    pcVar3 = reg(0,(int *)((long)&uStack_38 + 4));
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "RegularExpression::compile(): Error in compile.";
    }
    else {
      this->searchstring = (char *)0x0;
      this->endp[0] = (char *)0x0;
      this->startp[0] = (char *)0x0;
      if ((long)regsize < 0x7fff) {
        if (this->program != (char *)0x0) {
          operator_delete__(this->program);
        }
        uVar6 = regsize;
        pcVar3 = (char *)operator_new__(regsize);
        this->program = pcVar3;
        this->progsize = (int)uVar6;
        regnpar = 1;
        regcode = pcVar3 + 1;
        regparse = exp;
        *pcVar3 = -100;
        reg(0,(int *)((long)&uStack_38 + 4));
        this->regstart = '\0';
        this->reganch = '\0';
        this->regmust = (char *)0x0;
        this->regmlen = 0;
        pcVar3 = this->program;
        uVar4 = (ulong)(ushort)(*(ushort *)(pcVar3 + 2) << 8 | *(ushort *)(pcVar3 + 2) >> 8);
        uVar6 = -uVar4;
        if (pcVar3[1] != '\a') {
          uVar6 = uVar4;
        }
        if (pcVar3[uVar6 + 1] != '\0') {
          return true;
        }
        if (pcVar3[4] == '\x01') {
          this->reganch = '\x01';
        }
        else if (pcVar3[4] == '\b') {
          this->regstart = pcVar3[7];
        }
        if ((uStack_38 & 0x400000000) == 0) {
          return true;
        }
        pcVar3 = pcVar3 + 4;
        uVar6 = 0;
        pcVar7 = (char *)0x0;
        do {
          cVar1 = *pcVar3;
          if (cVar1 == '\b') {
            sVar5 = strlen(pcVar3 + 3);
            if (uVar6 <= sVar5) {
              pcVar7 = pcVar3 + 3;
            }
            if (uVar6 < sVar5) {
              uVar6 = sVar5;
            }
          }
          if ((pcVar3 == &regdummy) ||
             (uVar2 = *(ushort *)(pcVar3 + 1) << 8 | *(ushort *)(pcVar3 + 1) >> 8, uVar2 == 0)) {
            pcVar3 = (char *)0x0;
          }
          else if (cVar1 == '\a') {
            pcVar3 = pcVar3 + -(ulong)uVar2;
          }
          else {
            pcVar3 = pcVar3 + uVar2;
          }
        } while (pcVar3 != (char *)0x0);
        this->regmust = pcVar7;
        this->regmlen = uVar6;
        return true;
      }
      pcVar3 = "RegularExpression::compile(): Expression too big.";
    }
  }
  puts(pcVar3);
  return false;
}

Assistant:

bool RegularExpression::compile (const char* exp) {
    const char* scan;
    const char* longest;
    size_t      len;
    int         flags;

    if (exp == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(No_Expr),
      printf ("RegularExpression::compile(): No expression supplied.\n");
      return false;
    }

    // First pass: determine size, legality.
    regparse = exp;
    regnpar = 1;
    regsize = 0L;
    regcode = &regdummy;
    regc(static_cast<char>(MAGIC));
    if(!reg(0, &flags))
      {
        printf ("RegularExpression::compile(): Error in compile.\n");
        return false;
      }
    this->startp[0] = this->endp[0] = this->searchstring = 0;

    // Small enough for pointer-storage convention?
    if (regsize >= 32767L) {    // Probably could be 65535L.
      //RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
      printf ("RegularExpression::compile(): Expression too big.\n");
      return false;
    }

    // Allocate space.
//#ifndef WIN32
    if (this->program != 0) delete [] this->program;
//#endif
    this->program = new char[regsize];
    this->progsize = static_cast<int>(regsize);

    if (this->program == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
      printf ("RegularExpression::compile(): Out of memory.\n");
      return false;
    }

    // Second pass: emit code.
    regparse = exp;
    regnpar = 1;
    regcode = this->program;
    regc(static_cast<char>(MAGIC));
    reg(0, &flags);

    // Dig out information for optimizations.
    this->regstart = '\0';              // Worst-case defaults.
    this->reganch = 0;
    this->regmust = 0;
    this->regmlen = 0;
    scan = this->program + 1;   // First BRANCH.
    if (OP(regnext(scan)) == END) {     // Only one top-level choice.
        scan = OPERAND(scan);

        // Starting-point info.
        if (OP(scan) == EXACTLY)
            this->regstart = *OPERAND(scan);
        else if (OP(scan) == BOL)
            this->reganch++;

         //
         // If there's something expensive in the r.e., find the longest
         // literal string that must appear and make it the regmust.  Resolve
         // ties in favor of later strings, since the regstart check works
         // with the beginning of the r.e. and avoiding duplication
         // strengthens checking.  Not a strong reason, but sufficient in the
         // absence of others.
         //
        if (flags & SPSTART) {
            longest = 0;
            len = 0;
            for (; scan != 0; scan = regnext(scan))
                if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
                    longest = OPERAND(scan);
                    len = strlen(OPERAND(scan));
                }
            this->regmust = longest;
            this->regmlen = len;
        }
    }
    return true;
}